

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_2str.c
# Opt level: O2

char * strof_rc_mode(MppEncRcMode rc_mode)

{
  if (rc_mode < MPP_ENC_RC_MODE_BUTT) {
    return strof_rc_mode_rc_mode_str_rel +
           *(int *)(strof_rc_mode_rc_mode_str_rel + (ulong)rc_mode * 4);
  }
  return (char *)0x0;
}

Assistant:

const char *strof_rc_mode(MppEncRcMode rc_mode)
{
    static const char *rc_mode_str[] = {
        "vbr",
        "cbr",
        "fixqp",
        "avbr",
        "smtrc"
    };

    if (rc_mode >= MPP_ENC_RC_MODE_VBR && rc_mode < MPP_ENC_RC_MODE_BUTT)
        return rc_mode_str[rc_mode];

    return NULL;
}